

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand.c
# Opt level: O3

CURLcode Curl_rand_alnum(Curl_easy *data,uchar *rnd,size_t num)

{
  CURLcode CVar1;
  undefined8 in_RAX;
  long lVar2;
  uint r;
  undefined8 uStack_38;
  
  lVar2 = num - 1;
  if (lVar2 != 0) {
    uStack_38 = in_RAX;
    do {
      do {
        CVar1 = Curl_ssl_random(data,(uchar *)((long)&uStack_38 + 4),4);
        if (CVar1 != CURLE_OK) {
          return CVar1;
        }
      } while (0xfffffffb < uStack_38._4_4_);
      *rnd = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789"
             [((uStack_38._4_4_ >> 1) / 0x1f) * -0x3f + (uStack_38._4_4_ >> 1) / 0x1f +
              uStack_38._4_4_];
      rnd = rnd + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  *rnd = '\0';
  return CURLE_OK;
}

Assistant:

CURLcode Curl_rand_alnum(struct Curl_easy *data, unsigned char *rnd,
                         size_t num)
{
  CURLcode result = CURLE_OK;
  const unsigned int alnumspace = sizeof(alnum) - 1;
  unsigned int r;
  DEBUGASSERT(num > 1);

  num--; /* save one for null-termination */

  while(num) {
    do {
      result = randit(data, &r, TRUE);
      if(result)
        return result;
    } while(r >= (UINT_MAX - UINT_MAX % alnumspace));

    *rnd++ = (unsigned char)alnum[r % alnumspace];
    num--;
  }
  *rnd = 0;

  return result;
}